

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert16BitTo16Bit
               (s16 *in,s16 *out,s32 width,s32 height,s32 linepad,bool flip)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  s16 *__dest;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  if (out != (s16 *)0x0 && in != (s16 *)0x0) {
    uVar3 = (ulong)width;
    uVar6 = 0;
    uVar4 = uVar3;
    uVar1 = uVar6;
    uVar2 = uVar6;
    if (flip) {
      uVar4 = uVar6;
      uVar1 = (long)(height * width);
      uVar2 = -uVar3;
    }
    if (0 < height) {
      uVar6 = (ulong)(uint)height;
    }
    __dest = out + uVar2 + uVar1;
    while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
      memcpy(__dest,in,uVar3 * 2);
      __dest = __dest + uVar2 + uVar4;
      in = in + uVar3 + (long)linepad;
    }
  }
  return;
}

Assistant:

void CColorConverter::convert16BitTo16Bit(const s16 *in, s16 *out, s32 width, s32 height, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	if (flip)
		out += width * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= width;
#ifdef __BIG_ENDIAN__
		for (s32 x = 0; x < width; ++x)
			out[x] = os::Byteswap::byteswap(in[x]);
#else
		memcpy(out, in, width * sizeof(s16));
#endif
		if (!flip)
			out += width;
		in += width;
		in += linepad;
	}
}